

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t T_size)

{
  int iVar1;
  mbedtls_mpi *X;
  mbedtls_mpi *pmVar2;
  size_t sVar3;
  bool bVar4;
  mbedtls_mpi Zi;
  mbedtls_mpi ZZi;
  mbedtls_mpi u;
  
  if (T_size < 2) {
    iVar1 = ecp_normalize_jac(grp,*T);
    return iVar1;
  }
  X = (mbedtls_mpi *)calloc(T_size,0x18);
  pmVar2 = X;
  sVar3 = T_size;
  if (X == (mbedtls_mpi *)0x0) {
    iVar1 = -0x4d80;
  }
  else {
    while (sVar3 != 0) {
      mbedtls_mpi_init(pmVar2);
      pmVar2 = pmVar2 + 1;
      sVar3 = sVar3 - 1;
    }
    mbedtls_mpi_init(&u);
    mbedtls_mpi_init(&Zi);
    mbedtls_mpi_init(&ZZi);
    iVar1 = mbedtls_mpi_copy(X,&(*T)->Z);
    if (iVar1 == 0) {
      sVar3 = 1;
      pmVar2 = X;
      do {
        if (T_size == sVar3) {
          iVar1 = mbedtls_mpi_inv_mod(&u,X + (T_size - 1),&grp->P);
          if (iVar1 == 0) {
            pmVar2 = X + (T_size - 2);
            sVar3 = T_size;
            goto LAB_0011b2b5;
          }
          break;
        }
        iVar1 = mbedtls_mpi_mul_mod(grp,pmVar2 + 1,pmVar2,&T[sVar3]->Z);
        sVar3 = sVar3 + 1;
        pmVar2 = pmVar2 + 1;
      } while (iVar1 == 0);
    }
LAB_0011b22b:
    mbedtls_mpi_free(&u);
    mbedtls_mpi_free(&Zi);
    mbedtls_mpi_free(&ZZi);
    pmVar2 = X;
    while (bVar4 = T_size != 0, T_size = T_size - 1, bVar4) {
      mbedtls_mpi_free(pmVar2);
      pmVar2 = pmVar2 + 1;
    }
    free(X);
  }
  return iVar1;
LAB_0011b2b5:
  if (sVar3 == 1) {
    iVar1 = mbedtls_mpi_copy(&Zi,&u);
  }
  else {
    iVar1 = mbedtls_mpi_mul_mod(grp,&Zi,&u,pmVar2);
    if (iVar1 != 0) goto LAB_0011b22b;
    iVar1 = mbedtls_mpi_mul_mod(grp,&u,&u,&T[sVar3 - 1]->Z);
  }
  if ((((iVar1 != 0) || (iVar1 = mbedtls_mpi_mul_mod(grp,&ZZi,&Zi,&Zi), iVar1 != 0)) ||
      (iVar1 = mbedtls_mpi_mul_mod(grp,&T[sVar3 - 1]->X,&T[sVar3 - 1]->X,&ZZi), iVar1 != 0)) ||
     (((iVar1 = mbedtls_mpi_mul_mod(grp,&T[sVar3 - 1]->Y,&T[sVar3 - 1]->Y,&ZZi), iVar1 != 0 ||
       (iVar1 = mbedtls_mpi_mul_mod(grp,&T[sVar3 - 1]->Y,&T[sVar3 - 1]->Y,&Zi), iVar1 != 0)) ||
      ((iVar1 = mbedtls_mpi_shrink(&T[sVar3 - 1]->X,(grp->P).n), iVar1 != 0 ||
       (iVar1 = mbedtls_mpi_shrink(&T[sVar3 - 1]->Y,(grp->P).n), iVar1 != 0)))))) goto LAB_0011b22b;
  mbedtls_mpi_free(&T[sVar3 - 1]->Z);
  pmVar2 = pmVar2 + -1;
  iVar1 = 0;
  sVar3 = sVar3 - 1;
  if (sVar3 == 0) goto LAB_0011b22b;
  goto LAB_0011b2b5;
}

Assistant:

static int ecp_normalize_jac_many( const mbedtls_ecp_group *grp,
                                   mbedtls_ecp_point *T[], size_t T_size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi *c, u, Zi, ZZi;

    if( T_size < 2 )
        return( ecp_normalize_jac( grp, *T ) );

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_normalize_jac_many( grp, T, T_size ) );
#endif

    if( ( c = mbedtls_calloc( T_size, sizeof( mbedtls_mpi ) ) ) == NULL )
        return( MBEDTLS_ERR_ECP_ALLOC_FAILED );

    for( i = 0; i < T_size; i++ )
        mbedtls_mpi_init( &c[i] );

    mbedtls_mpi_init( &u ); mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * c[i] = Z_0 * ... * Z_i
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &c[0], &T[0]->Z ) );
    for( i = 1; i < T_size; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &c[i], &c[i-1], &T[i]->Z ) );
    }

    /*
     * u = 1 / (Z_0 * ... * Z_n) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &u, &c[T_size-1], &grp->P ) );

    for( i = T_size - 1; ; i-- )
    {
        /*
         * Zi = 1 / Z_i mod p
         * u = 1 / (Z_0 * ... * Z_i) mod P
         */
        if( i == 0 ) {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Zi, &u ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &Zi, &u, &c[i-1]  ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &u,  &u, &T[i]->Z ) );
        }

        /*
         * proceed as in normalize()
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ZZi,     &Zi,      &Zi  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->X, &T[i]->X, &ZZi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->Y, &T[i]->Y, &ZZi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->Y, &T[i]->Y, &Zi  ) );

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->X, grp->P.n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->Y, grp->P.n ) );
        mbedtls_mpi_free( &T[i]->Z );

        if( i == 0 )
            break;
    }

cleanup:

    mbedtls_mpi_free( &u ); mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );
    for( i = 0; i < T_size; i++ )
        mbedtls_mpi_free( &c[i] );
    mbedtls_free( c );

    return( ret );
}